

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void joystick_callback(int jid,int event)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  double dVar5;
  int hatCount;
  int buttonCount;
  int axisCount;
  int local_3c;
  uint local_38;
  uint local_34;
  
  uVar1 = counter;
  if (event == 0x40001) {
    glfwGetJoystickAxes(jid,(int *)&local_34);
    glfwGetJoystickButtons(jid,(int *)&local_38);
    glfwGetJoystickHats(jid,&local_3c);
    uVar1 = counter;
    counter = counter + 1;
    dVar5 = glfwGetTime();
    pcVar3 = glfwGetJoystickName(jid);
    printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes, %i buttons, and %i hats\n",
           dVar5,(ulong)uVar1,jid,pcVar3,(ulong)local_34,(ulong)local_38,local_3c);
    iVar2 = glfwJoystickIsGamepad(jid);
    pcVar3 = glfwGetJoystickGUID(jid);
    if (iVar2 == 0) {
      printf("  Joystick %i (%s) has no gamepad mapping\n",jid,pcVar3);
    }
    else {
      pcVar4 = glfwGetGamepadName(jid);
      printf("  Joystick %i (%s) has a gamepad mapping (%s)\n",jid,pcVar3,pcVar4);
    }
    return;
  }
  counter = counter + 1;
  glfwGetTime();
  printf("%08x at %0.3f: Joystick %i was disconnected\n",(ulong)uVar1,jid);
  return;
}

Assistant:

static void joystick_callback(int jid, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int axisCount, buttonCount, hatCount;

        glfwGetJoystickAxes(jid, &axisCount);
        glfwGetJoystickButtons(jid, &buttonCount);
        glfwGetJoystickHats(jid, &hatCount);

        printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes, %i buttons, and %i hats\n",
               counter++, glfwGetTime(),
               jid,
               glfwGetJoystickName(jid),
               axisCount,
               buttonCount,
               hatCount);

        if (glfwJoystickIsGamepad(jid))
        {
            printf("  Joystick %i (%s) has a gamepad mapping (%s)\n",
                   jid,
                   glfwGetJoystickGUID(jid),
                   glfwGetGamepadName(jid));
        }
        else
        {
            printf("  Joystick %i (%s) has no gamepad mapping\n",
                   jid,
                   glfwGetJoystickGUID(jid));
        }
    }
    else
    {
        printf("%08x at %0.3f: Joystick %i was disconnected\n",
               counter++, glfwGetTime(), jid);
    }
}